

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::validateField
          (Calendar *this,UCalendarDateFields field,int32_t min,int32_t max,UErrorCode *status)

{
  int32_t value;
  UErrorCode *status_local;
  int32_t max_local;
  int32_t min_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  if ((this->fFields[field] < min) || (max < this->fFields[field])) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

void Calendar::validateField(UCalendarDateFields field, int32_t min, int32_t max, UErrorCode& status)
{
    int32_t value = fFields[field];
    if (value < min || value > max) {
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because of field %s out of range %d..%d  at %d\n",
            __FILE__, __LINE__,fldName(field),min,max,value);
#endif
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
}